

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O3

string * __thiscall
cmCommonTargetGenerator::GetCompilerLauncher
          (string *__return_storage_ptr__,cmCommonTargetGenerator *this,string *lang,string *config)

{
  pointer pcVar1;
  int iVar2;
  string *psVar3;
  cmLocalGenerator *lg;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string local_a0;
  string clauncher_prop;
  string evaluatedClauncher;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar2 = std::__cxx11::string::compare((char *)lang);
  if (((((iVar2 != 0) && (iVar2 = std::__cxx11::string::compare((char *)lang), iVar2 != 0)) &&
       (iVar2 = std::__cxx11::string::compare((char *)lang), iVar2 != 0)) &&
      ((iVar2 = std::__cxx11::string::compare((char *)lang), iVar2 != 0 &&
       (iVar2 = std::__cxx11::string::compare((char *)lang), iVar2 != 0)))) &&
     ((iVar2 = std::__cxx11::string::compare((char *)lang), iVar2 != 0 &&
      ((iVar2 = std::__cxx11::string::compare((char *)lang), iVar2 != 0 &&
       (iVar2 = std::__cxx11::string::compare((char *)lang), iVar2 != 0)))))) {
    return __return_storage_ptr__;
  }
  evaluatedClauncher._M_string_length = (size_type)(lang->_M_dataplus)._M_p;
  evaluatedClauncher._M_dataplus._M_p = (pointer)lang->_M_string_length;
  evaluatedClauncher.field_2._M_allocated_capacity = 0;
  evaluatedClauncher.field_2._8_8_ = 0x12;
  views._M_len = 2;
  views._M_array = (iterator)&evaluatedClauncher;
  cmCatViews(&clauncher_prop,views);
  psVar3 = (string *)cmGeneratorTarget::GetProperty(this->GeneratorTarget,&clauncher_prop);
  if (psVar3 == (string *)0x0) {
    psVar3 = &cmValue::Empty_abi_cxx11_;
  }
  pcVar1 = (psVar3->_M_dataplus)._M_p;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,pcVar1,pcVar1 + psVar3->_M_string_length);
  lg = cmGeneratorTarget::GetLocalGenerator(this->GeneratorTarget);
  cmGeneratorExpression::Evaluate
            (&evaluatedClauncher,&local_a0,lg,config,this->GeneratorTarget,
             (cmGeneratorExpressionDAGChecker *)0x0,this->GeneratorTarget,lang);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (evaluatedClauncher._M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)evaluatedClauncher._M_dataplus._M_p != &evaluatedClauncher.field_2) {
    operator_delete(evaluatedClauncher._M_dataplus._M_p,
                    evaluatedClauncher.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)clauncher_prop._M_dataplus._M_p != &clauncher_prop.field_2) {
    operator_delete(clauncher_prop._M_dataplus._M_p,clauncher_prop.field_2._M_allocated_capacity + 1
                   );
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCommonTargetGenerator::GetCompilerLauncher(
  std::string const& lang, std::string const& config)
{
  std::string compilerLauncher;
  if (lang == "C" || lang == "CXX" || lang == "Fortran" || lang == "CUDA" ||
      lang == "HIP" || lang == "ISPC" || lang == "OBJC" || lang == "OBJCXX") {
    std::string const clauncher_prop = cmStrCat(lang, "_COMPILER_LAUNCHER");
    cmValue clauncher = this->GeneratorTarget->GetProperty(clauncher_prop);
    std::string const evaluatedClauncher = cmGeneratorExpression::Evaluate(
      *clauncher, this->GeneratorTarget->GetLocalGenerator(), config,
      this->GeneratorTarget, nullptr, this->GeneratorTarget, lang);
    if (!evaluatedClauncher.empty()) {
      compilerLauncher = evaluatedClauncher;
    }
  }
  return compilerLauncher;
}